

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

bool __thiscall
Builder::ExtractDeps
          (Builder *this,Result *result,string *deps_type,string *deps_prefix,
          vector<Node_*,_std::allocator<Node_*>_> *deps_nodes,string *err)

{
  CLParser *this_00;
  State *pSVar1;
  bool bVar2;
  int iVar3;
  reference str;
  ulong uVar4;
  size_type __n;
  pointer pSVar5;
  reference pSVar6;
  int *piVar7;
  char *pcVar8;
  undefined8 uVar9;
  allocator<char> local_231;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  allocator<char> local_209;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  char *local_1a8;
  size_t sStack_1a0;
  Node *local_190;
  uint64_t local_188;
  uint64_t slash_bits;
  __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
  local_178;
  iterator i_1;
  undefined1 local_168 [8];
  DepfileParser deps;
  string content;
  string local_108 [32];
  undefined1 local_e8 [8];
  string depfile;
  Node *local_b8;
  _Self local_b0;
  _Self local_a8;
  iterator i;
  undefined1 local_90 [8];
  string output;
  CLParser parser;
  string *err_local;
  vector<Node_*,_std::allocator<Node_*>_> *deps_nodes_local;
  string *deps_prefix_local;
  string *deps_type_local;
  Result *result_local;
  Builder *this_local;
  
  bVar2 = std::operator==(deps_type,"msvc");
  if (bVar2) {
    this_00 = (CLParser *)((long)&output.field_2 + 8);
    CLParser::CLParser(this_00);
    std::__cxx11::string::string((string *)local_90);
    bVar2 = CLParser::Parse(this_00,&result->output,deps_prefix,(string *)local_90,err);
    if (bVar2) {
      std::__cxx11::string::operator=((string *)&result->output,(string *)local_90);
      local_a8._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&output.field_2 + 8));
      while( true ) {
        local_b0._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&output.field_2 + 8));
        bVar2 = std::operator!=(&local_a8,&local_b0);
        if (!bVar2) break;
        pSVar1 = this->state_;
        str = std::
              _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*(&local_a8);
        StringPiece::StringPiece((StringPiece *)((long)&depfile.field_2 + 8),str);
        local_b8 = State::GetNode(pSVar1,stack0xffffffffffffff38,0xffffffff);
        std::vector<Node_*,_std::allocator<Node_*>_>::push_back(deps_nodes,&local_b8);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_a8);
      }
      i._M_node._0_4_ = 0;
    }
    else {
      this_local._7_1_ = 0;
      i._M_node._0_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_90);
    CLParser::~CLParser((CLParser *)((long)&output.field_2 + 8));
    goto joined_r0x00121fe0;
  }
  bVar2 = std::operator==(deps_type,"gcc");
  if (!bVar2) {
    uVar9 = std::__cxx11::string::c_str();
    Fatal("unknown deps type \'%s\'",uVar9);
  }
  Edge::GetUnescapedDepfile_abi_cxx11_((string *)local_e8,result->edge);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::string((string *)&deps.options_);
    iVar3 = (*(this->disk_interface_->super_FileReader)._vptr_FileReader[2])
                      (this->disk_interface_,local_e8,&deps.options_,err);
    if (iVar3 == 0) {
LAB_0012215d:
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        DepfileParser::DepfileParser((DepfileParser *)local_168);
        bVar2 = DepfileParser::Parse((DepfileParser *)local_168,(string *)&deps.options_,err);
        if (bVar2) {
          __n = std::vector<StringPiece,_std::allocator<StringPiece>_>::size
                          ((vector<StringPiece,_std::allocator<StringPiece>_> *)
                           &deps.outs_.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<Node_*,_std::allocator<Node_*>_>::reserve(deps_nodes,__n);
          local_178._M_current =
               (StringPiece *)
               std::vector<StringPiece,_std::allocator<StringPiece>_>::begin
                         ((vector<StringPiece,_std::allocator<StringPiece>_> *)
                          &deps.outs_.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
          while( true ) {
            slash_bits = (uint64_t)
                         std::vector<StringPiece,_std::allocator<StringPiece>_>::end
                                   ((vector<StringPiece,_std::allocator<StringPiece>_> *)
                                    &deps.outs_.
                                     super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage);
            bVar2 = __gnu_cxx::operator!=
                              (&local_178,
                               (__normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
                                *)&slash_bits);
            if (!bVar2) break;
            pSVar5 = __gnu_cxx::
                     __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
                     ::operator->(&local_178);
            pcVar8 = pSVar5->str_;
            pSVar5 = __gnu_cxx::
                     __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
                     ::operator->(&local_178);
            CanonicalizePath(pcVar8,&pSVar5->len_,&local_188);
            pSVar1 = this->state_;
            pSVar6 = __gnu_cxx::
                     __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
                     ::operator*(&local_178);
            local_1a8 = pSVar6->str_;
            sStack_1a0 = pSVar6->len_;
            local_190 = State::GetNode(pSVar1,*pSVar6,local_188);
            std::vector<Node_*,_std::allocator<Node_*>_>::push_back(deps_nodes,&local_190);
            __gnu_cxx::
            __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
            ::operator++(&local_178);
          }
          if (((g_keep_depfile & 1U) == 0) &&
             (iVar3 = (*(this->disk_interface_->super_FileReader)._vptr_FileReader[6])
                                (this->disk_interface_,local_e8), iVar3 < 0)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_208,"deleting depfile: ",&local_209);
            piVar7 = __errno_location();
            pcVar8 = strerror(*piVar7);
            std::operator+(&local_1e8,&local_208,pcVar8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"\n",&local_231)
            ;
            std::operator+(&local_1c8,&local_1e8,&local_230);
            std::__cxx11::string::operator=((string *)err,(string *)&local_1c8);
            std::__cxx11::string::~string((string *)&local_1c8);
            std::__cxx11::string::~string((string *)&local_230);
            std::allocator<char>::~allocator(&local_231);
            std::__cxx11::string::~string((string *)&local_1e8);
            std::__cxx11::string::~string((string *)&local_208);
            std::allocator<char>::~allocator(&local_209);
            this_local._7_1_ = 0;
            i._M_node._0_4_ = 1;
          }
          else {
            i._M_node._0_4_ = 0;
          }
        }
        else {
          this_local._7_1_ = 0;
          i._M_node._0_4_ = 1;
        }
        DepfileParser::~DepfileParser((DepfileParser *)local_168);
      }
      else {
        this_local._7_1_ = 1;
        i._M_node._0_4_ = 1;
      }
    }
    else {
      if (iVar3 == 1) {
        std::__cxx11::string::clear();
        goto LAB_0012215d;
      }
      if (iVar3 != 2) goto LAB_0012215d;
      this_local._7_1_ = 0;
      i._M_node._0_4_ = 1;
    }
    std::__cxx11::string::~string((string *)&deps.options_);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_108,"edge with deps=gcc but no depfile makes no sense",
               (allocator<char> *)(content.field_2._M_local_buf + 0xf));
    std::__cxx11::string::operator=((string *)err,local_108);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)(content.field_2._M_local_buf + 0xf));
    this_local._7_1_ = 0;
    i._M_node._0_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_e8);
joined_r0x00121fe0:
  if ((int)i._M_node == 0) {
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Builder::ExtractDeps(CommandRunner::Result* result,
                          const string& deps_type,
                          const string& deps_prefix,
                          vector<Node*>* deps_nodes,
                          string* err) {
  if (deps_type == "msvc") {
    CLParser parser;
    string output;
    if (!parser.Parse(result->output, deps_prefix, &output, err))
      return false;
    result->output = output;
    for (set<string>::iterator i = parser.includes_.begin();
         i != parser.includes_.end(); ++i) {
      // ~0 is assuming that with MSVC-parsed headers, it's ok to always make
      // all backslashes (as some of the slashes will certainly be backslashes
      // anyway). This could be fixed if necessary with some additional
      // complexity in IncludesNormalize::Relativize.
      deps_nodes->push_back(state_->GetNode(*i, ~0u));
    }
  } else if (deps_type == "gcc") {
    string depfile = result->edge->GetUnescapedDepfile();
    if (depfile.empty()) {
      *err = string("edge with deps=gcc but no depfile makes no sense");
      return false;
    }

    // Read depfile content.  Treat a missing depfile as empty.
    string content;
    switch (disk_interface_->ReadFile(depfile, &content, err)) {
    case DiskInterface::Okay:
      break;
    case DiskInterface::NotFound:
      err->clear();
      break;
    case DiskInterface::OtherError:
      return false;
    }
    if (content.empty())
      return true;

    DepfileParser deps(config_.depfile_parser_options);
    if (!deps.Parse(&content, err))
      return false;

    // XXX check depfile matches expected output.
    deps_nodes->reserve(deps.ins_.size());
    for (vector<StringPiece>::iterator i = deps.ins_.begin();
         i != deps.ins_.end(); ++i) {
      uint64_t slash_bits;
      CanonicalizePath(const_cast<char*>(i->str_), &i->len_, &slash_bits);
      deps_nodes->push_back(state_->GetNode(*i, slash_bits));
    }

    if (!g_keep_depfile) {
      if (disk_interface_->RemoveFile(depfile) < 0) {
        *err = string("deleting depfile: ") + strerror(errno) + string("\n");
        return false;
      }
    }
  } else {
    Fatal("unknown deps type '%s'", deps_type.c_str());
  }

  return true;
}